

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

void __thiscall
soul::heart::AggregateInitialiserList::AggregateInitialiserList
          (AggregateInitialiserList *this,CodeLocation *l,Type *t)

{
  Structure *pSVar1;
  Category CVar2;
  bool bVar3;
  bool bVar4;
  BoundedIntSize BVar5;
  CodeLocation local_28;
  
  local_28.sourceCode.object = (l->sourceCode).object;
  local_28.location.data = (l->location).data;
  (l->sourceCode).object = (SourceCodeText *)0x0;
  Expression::Expression(&this->super_Expression,&local_28);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_28.sourceCode.object);
  (this->super_Expression).super_Object._vptr_Object =
       (_func_int **)&PTR__AggregateInitialiserList_002fb1d8;
  CVar2 = t->arrayElementCategory;
  bVar3 = t->isRef;
  bVar4 = t->isConstant;
  (this->type).category = t->category;
  (this->type).arrayElementCategory = CVar2;
  (this->type).isRef = bVar3;
  (this->type).isConstant = bVar4;
  (this->type).primitiveType.type = (t->primitiveType).type;
  BVar5 = t->arrayElementBoundingSize;
  (this->type).boundingSize = t->boundingSize;
  (this->type).arrayElementBoundingSize = BVar5;
  pSVar1 = (t->structure).object;
  (this->type).structure.object = pSVar1;
  if (pSVar1 != (Structure *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  (this->items).items = (pool_ref<soul::heart::Expression> *)(this->items).space;
  (this->items).numActive = 0;
  (this->items).numAllocated = 4;
  return;
}

Assistant:

AggregateInitialiserList (CodeLocation l, const Type& t) : Expression (std::move (l)), type (t) {}